

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O1

Fl_Widget * make_widget_browser(int x,int y,int w,int h)

{
  Fl_Browser_ *this;
  
  this = (Fl_Browser_ *)operator_new(0x268);
  Fl_Browser_::Fl_Browser_(this,x,y,w,h,(char *)0x0);
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Browser__00272b50;
  (this->super_Fl_Group).super_Fl_Widget.type_ = '\x03';
  (this->super_Fl_Group).super_Fl_Widget.callback_ = Widget_Browser_callback;
  (this->super_Fl_Group).super_Fl_Widget.when_ = '\x04';
  widget_browser = (Widget_Browser *)this;
  return (Fl_Widget *)this;
}

Assistant:

Fl_Widget *make_widget_browser(int x,int y,int w,int h) {
  return (widget_browser = new Widget_Browser(x,y,w,h));
}